

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::remove_fanout_one_wires(Generator *top)

{
  undefined1 local_58 [8];
  VarFanOutVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  VarFanOutVisitor::VarFanOutVisitor((VarFanOutVisitor *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  VarFanOutVisitor::~VarFanOutVisitor((VarFanOutVisitor *)local_58);
  return;
}

Assistant:

void remove_fanout_one_wires(Generator* top) {
    VarFanOutVisitor visitor;
    visitor.visit_generator_root_p(top);
}